

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::child_pos(Tree *this,size_t node,size_t ch)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  
  sVar1 = first_child(this,node);
  bVar3 = sVar1 == 0xffffffffffffffff;
  sVar2 = 0;
  if (sVar1 != ch && !bVar3) {
    do {
      sVar2 = sVar2 + 1;
      sVar1 = next_sibling(this,sVar1);
      bVar3 = sVar1 == 0xffffffffffffffff;
      if (bVar3) break;
    } while (sVar1 != ch);
  }
  sVar1 = 0xffffffffffffffff;
  if (!bVar3) {
    sVar1 = sVar2;
  }
  return sVar1;
}

Assistant:

size_t Tree::child_pos(size_t node, size_t ch) const
{
    size_t count = 0;
    for(size_t i = first_child(node); i != NONE; i = next_sibling(i))
    {
        if(i == ch)
            return count;
        ++count;
    }
    return npos;
}